

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingImageTest::prepareTexture
          (BindingImageTest *this,texture *texture,buffer *buffer,TEXTURE_TYPES texture_type,
          GLuint color,GLuint unit)

{
  int iVar1;
  deUint32 err;
  size_type sVar2;
  reference pvVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  sockaddr *__addr;
  ulong __n;
  Functions *gl;
  undefined1 local_55;
  GLuint i;
  GLboolean is_layered;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  GLuint unit_local;
  GLuint color_local;
  TEXTURE_TYPES texture_type_local;
  buffer *buffer_local;
  texture *texture_local;
  BindingImageTest *this_local;
  
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = unit;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  __n = 0x600;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0x600);
  local_55 = 0;
  gl._4_4_ = 0;
  while( true ) {
    iVar1 = (int)__n;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
    if (sVar2 <= gl._4_4_) break;
    __n = (ulong)gl._4_4_;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,__n);
    *pvVar3 = color;
    gl._4_4_ = gl._4_4_ + 1;
  }
  if (texture_type == TEX_BUFFER) {
    Utils::buffer::bind(buffer,iVar1,__addr,(socklen_t)sVar2);
    Utils::texture::createBuffer(texture,0x8058,buffer->m_id);
  }
  else {
    Utils::texture::create(texture,0x10,0x10,6,0x8058,texture_type);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0);
    Utils::texture::update(texture,0x10,0x10,6,0x1908,0x1401,pvVar3);
  }
  if ((texture_type - TEX_2D_ARRAY < 3) || (texture_type == TEX_1D_ARRAY)) {
    local_55 = 1;
  }
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x80))
            (texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,texture->m_id,0,local_55,0,0x88ba,
             0x8058);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"BindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x962);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  return;
}

Assistant:

void BindingImageTest::prepareTexture(Utils::texture& texture, const Utils::buffer& buffer,
									  Utils::TEXTURE_TYPES texture_type, GLuint color, GLuint unit)
{
	std::vector<GLuint> texture_data;
	texture_data.resize(m_width * m_height * m_depth);

	GLboolean is_layered = GL_FALSE;

	for (GLuint i = 0; i < texture_data.size(); ++i)
	{
		texture_data[i] = color;
	}

	if (Utils::TEX_BUFFER != texture_type)
	{
		texture.create(m_width, m_height, m_depth, GL_RGBA8, texture_type);

		texture.update(m_width, m_height, m_depth, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);
	}
	else
	{
		buffer.bind();

		texture.createBuffer(GL_RGBA8, buffer.m_id);
	}

	switch (texture_type)
	{
	case Utils::TEX_1D_ARRAY:
	case Utils::TEX_2D_ARRAY:
	case Utils::TEX_3D:
	case Utils::TEX_CUBE:
		is_layered = GL_TRUE;
		break;
	default:
		break;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindImageTexture(unit, texture.m_id, 0 /* level */, is_layered /* layered */, 0 /* layer */, GL_READ_WRITE,
						GL_RGBA8);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
}